

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O2

bool __thiscall rw::Clump::streamWrite(Clump *this,Stream *stream)

{
  LinkList *this_00;
  LinkList *this_01;
  LinkList *this_02;
  LLLink *pLVar1;
  uint32 uVar2;
  int32 iVar3;
  int32 iVar4;
  LLLink *pLVar5;
  int size;
  FrameList_ frmlst;
  int32 buf [3];
  
  uVar2 = streamGetSize(this);
  size = 0x10;
  writeChunkHeader(stream,0x10,uVar2);
  this_00 = &this->atomics;
  iVar3 = LinkList::count(this_00);
  this_01 = &this->lights;
  iVar4 = LinkList::count(this_01);
  this_02 = &this->cameras;
  buf[2] = LinkList::count(this_02);
  uVar2 = (uint)(0x33000 < version) * 8 + 4;
  buf[0] = iVar3;
  buf[1] = iVar4;
  writeChunkHeader(stream,1,uVar2);
  Stream::write32(stream,buf,uVar2);
  frmlst.numFrames = Frame::count((Frame *)(this->object).parent);
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp line: 302"
  ;
  frmlst.frames = (Frame **)(*Engine::memfuncs)((long)frmlst.numFrames << 3,0x10010);
  makeFrameList((Frame *)(this->object).parent,frmlst.frames);
  FrameList_::streamWrite(&frmlst,stream);
  pLVar5 = (this->atomics).link.next;
  if (0x303ff < version) {
    while (pLVar5 != &this_00->link) {
      pLVar1 = pLVar5 + -3;
      pLVar5 = pLVar5->next;
      uVar2 = Geometry::streamGetSize((Geometry *)pLVar1->next);
      size = size + uVar2 + 0xc;
    }
    writeChunkHeader(stream,0x1a,size);
    writeChunkHeader(stream,1,4);
    Stream::writeI32(stream,iVar3);
    pLVar5 = (this_00->link).next;
    while (pLVar5 != &this_00->link) {
      pLVar1 = pLVar5 + -3;
      pLVar5 = pLVar5->next;
      Geometry::streamWrite((Geometry *)pLVar1->next,stream);
    }
    pLVar5 = (this_00->link).next;
  }
  while (pLVar5 != &this_00->link) {
    pLVar1 = pLVar5->next;
    Atomic::streamWriteClump((Atomic *)&pLVar5[-6].prev,stream,&frmlst);
    pLVar5 = pLVar1;
  }
  pLVar5 = (this_01->link).next;
  while (pLVar5 != &this_01->link) {
    pLVar1 = pLVar5->next;
    iVar3 = findPointer(pLVar5[-5].next,frmlst.frames,frmlst.numFrames);
    if (iVar3 < 0) {
      return false;
    }
    writeChunkHeader(stream,1,4);
    Stream::writeI32(stream,iVar3);
    Light::streamWrite((Light *)&pLVar5[-6].prev,stream);
    pLVar5 = pLVar1;
  }
  pLVar5 = (this_02->link).next;
  while( true ) {
    if (pLVar5 == &this_02->link) {
      (*DAT_00143840)(frmlst.frames);
      PluginList::streamWrite((PluginList *)&s_plglist,stream,this);
      return true;
    }
    pLVar1 = pLVar5->next;
    iVar3 = findPointer(pLVar5[-0x22].next,frmlst.frames,frmlst.numFrames);
    if (iVar3 < 0) break;
    writeChunkHeader(stream,1,4);
    Stream::writeI32(stream,iVar3);
    Camera::streamWrite((Camera *)&pLVar5[-0x23].prev,stream);
    pLVar5 = pLVar1;
  }
  return false;
}

Assistant:

bool
Clump::streamWrite(Stream *stream)
{
	int size = this->streamGetSize();
	writeChunkHeader(stream, ID_CLUMP, size);
	int32 numAtomics = this->countAtomics();
	int32 numLights = this->countLights();
	int32 numCameras = this->countCameras();
	int32 buf[3] = { numAtomics, numLights, numCameras };
	size = version > 0x33000 ? 12 : 4;
	writeChunkHeader(stream, ID_STRUCT, size);
	stream->write32(buf, size);

	FrameList_ frmlst;
	frmlst.numFrames = this->getFrame()->count();
	frmlst.frames = (Frame**)rwMalloc(frmlst.numFrames*sizeof(Frame*), MEMDUR_FUNCTION | ID_CLUMP);
	makeFrameList(this->getFrame(), frmlst.frames);
	frmlst.streamWrite(stream);

	if(rw::version >= 0x30400){
		size = 12+4;
		FORLIST(lnk, this->atomics)
			size += 12 + Atomic::fromClump(lnk)->geometry->streamGetSize();
		writeChunkHeader(stream, ID_GEOMETRYLIST, size);
		writeChunkHeader(stream, ID_STRUCT, 4);
		stream->writeI32(numAtomics);	// same as numGeometries
		FORLIST(lnk, this->atomics)
			Atomic::fromClump(lnk)->geometry->streamWrite(stream);
	}

	FORLIST(lnk, this->atomics)
		Atomic::fromClump(lnk)->streamWriteClump(stream, &frmlst);

	FORLIST(lnk, this->lights){
		Light *l = Light::fromClump(lnk);
		int frm = findPointer(l->getFrame(), (void**)frmlst.frames, frmlst.numFrames);
		if(frm < 0)
			return false;
		writeChunkHeader(stream, ID_STRUCT, 4);
		stream->writeI32(frm);
		l->streamWrite(stream);
	}

	FORLIST(lnk, this->cameras){
		Camera *c = Camera::fromClump(lnk);
		int frm = findPointer(c->getFrame(), (void**)frmlst.frames, frmlst.numFrames);
		if(frm < 0)
			return false;
		writeChunkHeader(stream, ID_STRUCT, 4);
		stream->writeI32(frm);
		c->streamWrite(stream);
	}

	rwFree(frmlst.frames);

	s_plglist.streamWrite(stream, this);
	return true;
}